

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::TextureViewVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator=
          (RefCntAutoPtr<Diligent::TextureViewVkImpl> *this,TextureViewVkImpl *pObj)

{
  TextureViewVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (TextureViewVkImpl *)0x0) {
      DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
      ::Release((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (TextureViewVkImpl *)0x0) {
      RefCountedObject<Diligent::ITextureViewVk>::AddRef
                ((RefCountedObject<Diligent::ITextureViewVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }